

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

char * fy_node_get_tag(fy_node *fyn,size_t *lenp)

{
  undefined1 local_28 [8];
  size_t tmplen;
  size_t *lenp_local;
  fy_node *fyn_local;
  
  tmplen = (size_t)lenp;
  if (lenp == (size_t *)0x0) {
    tmplen = (size_t)local_28;
  }
  if ((fyn == (fy_node *)0x0) || (fyn->tag == (fy_token *)0x0)) {
    *(undefined8 *)tmplen = 0;
    fyn_local = (fy_node *)0x0;
  }
  else {
    lenp_local = (size_t *)fyn;
    fyn_local = (fy_node *)fy_token_get_text(fyn->tag,(size_t *)tmplen);
  }
  return (char *)fyn_local;
}

Assistant:

const char *fy_node_get_tag(struct fy_node *fyn, size_t *lenp) {
    size_t tmplen;

    if (!lenp)
        lenp = &tmplen;

    if (!fyn || !fyn->tag) {
        *lenp = 0;
        return NULL;
    }

    return fy_token_get_text(fyn->tag, lenp);
}